

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  FieldDescriptor *pFVar1;
  uint *puVar2;
  once_flag *__once;
  Reflection *pRVar3;
  bool bVar4;
  DescriptorPool *pDVar5;
  mapped_type *ppTVar6;
  mapped_type pTVar7;
  DescriptorPool *pDVar8;
  uint *puVar9;
  MessageFactory *pMVar10;
  undefined4 extraout_var;
  uint *puVar11;
  LogMessage *pLVar12;
  long *plVar13;
  DynamicMessage *this_00;
  Reflection *this_01;
  uint uVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  Descriptor *pDVar23;
  long lVar24;
  Descriptor *local_98;
  FieldDescriptor *local_90;
  uint *local_88;
  mapped_type local_80;
  DynamicMessageFactory *local_78;
  long local_70;
  undefined1 local_68 [24];
  int local_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_98 = type;
  if ((this->delegate_to_generated_factory_ == true) &&
     (pDVar8 = *(DescriptorPool **)(*(long *)(type + 0x10) + 0x10),
     pDVar5 = DescriptorPool::generated_pool(), pDVar8 == pDVar5)) {
    pMVar10 = MessageFactory::generated_factory();
    iVar22 = (*pMVar10->_vptr_MessageFactory[2])(pMVar10,type);
    return (Message *)CONCAT44(extraout_var,iVar22);
  }
  ppTVar6 = std::__detail::
            _Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::hash<const_google::protobuf::Descriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)(this->prototypes_)._M_t.
                            super___uniq_ptr_impl<google::protobuf::DynamicMessageFactory::PrototypeMap,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::DynamicMessageFactory::PrototypeMap_*,_std::default_delete<google::protobuf::DynamicMessageFactory::PrototypeMap>_>
                            .
                            super__Head_base<0UL,_google::protobuf::DynamicMessageFactory::PrototypeMap_*,_false>
                            ._M_head_impl,&local_98);
  if (*ppTVar6 == (mapped_type)0x0) {
    pTVar7 = (mapped_type)operator_new(0x58);
    pDVar23 = local_98;
    pTVar7->offsets =
         (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)0x0;
    pTVar7->has_bits_indices =
         (__uniq_ptr_data<unsigned_int,_std::default_delete<unsigned_int[]>,_true,_true>)0x0;
    pTVar7->reflection =
         (__uniq_ptr_data<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>,_true,_true>
          )0x0;
    pTVar7->prototype = (DynamicMessage *)0x0;
    *ppTVar6 = pTVar7;
    pTVar7->type = local_98;
    pDVar8 = this->pool_;
    if (pDVar8 == (DescriptorPool *)0x0) {
      pDVar8 = *(DescriptorPool **)(*(long *)(local_98 + 0x10) + 0x10);
    }
    pTVar7->pool = pDVar8;
    pTVar7->factory = this;
    uVar19 = 0xffffffffffffffff;
    if (-1 < (int)((long)*(int *)(local_98 + 0x6c) + (long)*(int *)(local_98 + 0x68))) {
      uVar19 = ((long)*(int *)(local_98 + 0x6c) + (long)*(int *)(local_98 + 0x68)) * 4;
    }
    puVar9 = (uint *)operator_new__(uVar19);
    puVar11 = (pTVar7->offsets)._M_t.
              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    (pTVar7->offsets)._M_t.super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
    ._M_t.super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = puVar9;
    if (puVar11 != (uint *)0x0) {
      operator_delete__(puVar11);
      pDVar23 = local_98;
    }
    local_78 = this;
    if (*(int *)(*(long *)(pDVar23 + 0x10) + 0x3c) == 3) {
      pTVar7->has_bits_offset = -1;
      uVar20 = 0x20;
    }
    else {
      pTVar7->has_bits_offset = 0x20;
      iVar22 = *(int *)(pDVar23 + 0x68);
      iVar16 = iVar22 + 0x3e;
      if (-1 < iVar22 + 0x1f) {
        iVar16 = iVar22 + 0x1f;
      }
      uVar14 = (iVar16 >> 5) * 4 + 0x27;
      uVar20 = (iVar16 >> 5) * 4 + 0x2e;
      if (-1 < (int)uVar14) {
        uVar20 = uVar14;
      }
      uVar19 = 0xffffffffffffffff;
      if (-1 < (long)iVar22) {
        uVar19 = (long)iVar22 * 4;
      }
      puVar11 = (uint *)operator_new__(uVar19);
      if (0 < *(int *)(pDVar23 + 0x68)) {
        lVar18 = 0;
        do {
          puVar11[lVar18] = (uint)lVar18;
          lVar18 = lVar18 + 1;
        } while (lVar18 < *(int *)(pDVar23 + 0x68));
      }
      uVar20 = uVar20 & 0xfffffff8;
      puVar2 = (pTVar7->has_bits_indices)._M_t.
               super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
               super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
      (pTVar7->has_bits_indices)._M_t.
      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = puVar11;
      if (puVar2 != (uint *)0x0) {
        operator_delete__(puVar2);
        pDVar23 = local_98;
      }
    }
    iVar22 = *(int *)(pDVar23 + 0x6c);
    if (0 < iVar22) {
      pTVar7->oneof_case_offset = uVar20;
      uVar14 = uVar20 + iVar22 * 4 + 7;
      uVar20 = uVar20 + iVar22 * 4 + 0xe;
      if (-1 < (int)uVar14) {
        uVar20 = uVar14;
      }
      uVar20 = uVar20 & 0xfffffff8;
    }
    if (*(int *)(pDVar23 + 0x78) < 1) {
      uVar15 = 0xffffffff;
      uVar14 = uVar20;
    }
    else {
      uVar14 = uVar20 + 0x26;
      if (-1 < (int)(uVar20 + 0x1f)) {
        uVar14 = uVar20 + 0x1f;
      }
      uVar14 = uVar14 & 0xfffffff8;
      uVar15 = uVar20;
    }
    pTVar7->extensions_offset = uVar15;
    local_80 = pTVar7;
    if (0 < *(int *)(pDVar23 + 0x68)) {
      lVar18 = 0;
      lVar24 = 0;
      local_88 = puVar9;
      do {
        lVar17 = *(long *)(pDVar23 + 0x28);
        if (*(long *)(lVar17 + 0x58 + lVar18) == 0) {
          pFVar1 = (FieldDescriptor *)(lVar17 + lVar18);
          __once = *(once_flag **)(lVar17 + 0x30 + lVar18);
          if (*(int *)(lVar17 + 0x3c + lVar18) == 3) {
            if (__once != (once_flag *)0x0) {
              local_68._0_8_ = FieldDescriptor::TypeOnceInit;
              local_90 = pFVar1;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (__once,(_func_void_FieldDescriptor_ptr **)local_68,&local_90);
            }
            iVar21 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                             (ulong)*(uint *)(lVar17 + 0x38 + lVar18) * 4);
            iVar22 = 8;
            puVar9 = local_88;
            iVar16 = 0x10;
            if (7 < iVar21 - 1U) {
              if (iVar21 == 9) {
                iVar16 = 0x18;
              }
              else {
                if (iVar21 != 10) goto LAB_002f3bb1;
                bVar4 = anon_unknown_0::IsMapFieldInApi(pFVar1);
                puVar9 = local_88;
                iVar16 = 0x18;
                if (bVar4) {
                  iVar16 = 0x68;
                }
              }
            }
          }
          else {
            if (__once != (once_flag *)0x0) {
              local_68._0_8_ = FieldDescriptor::TypeOnceInit;
              local_90 = pFVar1;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (__once,(_func_void_FieldDescriptor_ptr **)local_68,&local_90);
            }
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                        (ulong)*(uint *)(lVar17 + 0x38 + lVar18) * 4) - 1U < 10) {
              iVar22 = *(int *)(&DAT_005684a8 +
                               (ulong)(*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                               (ulong)*(uint *)(lVar17 + 0x38 + lVar18) * 4) - 1U) *
                               4);
              puVar9 = local_88;
              iVar16 = iVar22;
            }
            else {
LAB_002f3bb1:
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/dynamic_message.cc"
                         ,0xab);
              pLVar12 = internal::LogMessage::operator<<((LogMessage *)local_68,"Can\'t get here.");
              internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar12);
              puVar9 = local_88;
              internal::LogMessage::~LogMessage((LogMessage *)local_68);
              iVar22 = 0;
              iVar16 = 0;
            }
          }
          iVar21 = uVar14 + iVar22 + -1;
          uVar14 = iVar21 - iVar21 % iVar22;
          puVar9[lVar24] = uVar14;
          uVar14 = uVar14 + iVar16;
          pDVar23 = local_98;
        }
        lVar24 = lVar24 + 1;
        lVar18 = lVar18 + 0x98;
      } while (lVar24 < *(int *)(pDVar23 + 0x68));
      iVar22 = *(int *)(pDVar23 + 0x6c);
    }
    if (iVar22 < 1) {
      bVar4 = false;
    }
    else {
      lVar18 = 0;
      do {
        uVar20 = uVar14 + 0xe;
        if (-1 < (int)(uVar14 + 7)) {
          uVar20 = uVar14 + 7;
        }
        puVar9[*(int *)(pDVar23 + 0x68) + lVar18] = uVar20 & 0xfffffff8;
        uVar14 = (uVar20 & 0xfffffff8) + 8;
        lVar18 = lVar18 + 1;
      } while ((int)lVar18 < *(int *)(pDVar23 + 0x6c));
      bVar4 = 0 < *(int *)(pDVar23 + 0x6c);
    }
    uVar20 = uVar14 + 0xe;
    if (-1 < (int)(uVar14 + 7)) {
      uVar20 = uVar14 + 7;
    }
    local_80->internal_metadata_offset = uVar20 & 0xfffffff8;
    iVar22 = (uVar20 & 0xfffffff8) + 8;
    local_80->weak_field_map_offset = -1;
    local_80->size = iVar22;
    if (bVar4) {
      lVar18 = 0;
      do {
        lVar24 = *(long *)(pDVar23 + 0x30);
        lVar17 = lVar18 * 0x30;
        local_70 = lVar18;
        if (0 < *(int *)(lVar24 + 0x18 + lVar17)) {
          lVar18 = 0;
          do {
            pFVar1 = *(FieldDescriptor **)(*(long *)(lVar24 + 0x20 + lVar17) + lVar18 * 8);
            if (*(once_flag **)(pFVar1 + 0x30) != (once_flag *)0x0) {
              local_68._0_8_ = FieldDescriptor::TypeOnceInit;
              local_90 = pFVar1;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (*(once_flag **)(pFVar1 + 0x30),(_func_void_FieldDescriptor_ptr **)local_68,
                         &local_90);
            }
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar1 + 0x38) * 4) -
                1U < 10) {
              iVar16 = *(int *)(&DAT_005684a8 +
                               (ulong)(*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                               (ulong)*(uint *)(pFVar1 + 0x38) * 4) - 1U) * 4);
            }
            else {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/dynamic_message.cc"
                         ,0xd1);
              pLVar12 = internal::LogMessage::operator<<((LogMessage *)local_68,"Can\'t get here.");
              internal::LogFinisher::operator=((LogFinisher *)&local_90,pLVar12);
              internal::LogMessage::~LogMessage((LogMessage *)local_68);
              iVar16 = 0;
            }
            iVar22 = iVar22 + iVar16 + -1;
            if (pFVar1[0x42] == (FieldDescriptor)0x0) {
              plVar13 = (long *)(*(long *)(pFVar1 + 0x50) + 0x28);
            }
            else if (*(long *)(pFVar1 + 0x60) == 0) {
              plVar13 = (long *)(*(long *)(pFVar1 + 0x28) + 0x80);
            }
            else {
              plVar13 = (long *)(*(long *)(pFVar1 + 0x60) + 0x50);
            }
            uVar14 = iVar22 - iVar22 % iVar16;
            puVar9[(int)((ulong)((long)pFVar1 - *plVar13) >> 3) * 0x286bca1b] = uVar14;
            iVar22 = uVar14 + iVar16;
            lVar18 = lVar18 + 1;
            lVar24 = *(long *)(local_98 + 0x30);
            pDVar23 = local_98;
          } while (lVar18 < *(int *)(lVar24 + 0x18 + lVar17));
        }
        lVar18 = local_70 + 1;
      } while (lVar18 < *(int *)(pDVar23 + 0x6c));
    }
    uVar14 = iVar22 + 0xe;
    if (-1 < (int)(iVar22 + 7U)) {
      uVar14 = iVar22 + 7U;
    }
    this_00 = (DynamicMessage *)operator_new((long)(int)(uVar14 & 0xfffffff8));
    memset(this_00,0,(long)(int)(uVar14 & 0xfffffff8));
    pTVar7 = local_80;
    DynamicMessage::DynamicMessage(this_00,local_80,false);
    if (0 < *(int *)(local_98 + 0x6c)) {
      ConstructDefaultOneofInstance
                (pTVar7->type,
                 (pTVar7->offsets)._M_t.
                 super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                 super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl,this_00);
    }
    local_68._0_8_ = pTVar7->prototype;
    local_68._8_8_ =
         (pTVar7->offsets)._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    local_68._16_8_ =
         (pTVar7->has_bits_indices)._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    local_50 = pTVar7->has_bits_offset;
    iStack_44 = pTVar7->oneof_case_offset;
    iStack_4c = pTVar7->internal_metadata_offset;
    iStack_48 = pTVar7->extensions_offset;
    local_40._M_allocated_capacity._0_4_ = pTVar7->size;
    local_40._M_allocated_capacity._4_4_ = pTVar7->weak_field_map_offset;
    this_01 = (Reflection *)operator_new(0x50);
    Reflection::Reflection
              (this_01,pTVar7->type,(ReflectionSchema *)local_68,pTVar7->pool,
               &local_78->super_MessageFactory);
    pRVar3 = (pTVar7->reflection)._M_t.
             super___uniq_ptr_impl<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_google::protobuf::Reflection_*,_std::default_delete<const_google::protobuf::Reflection>_>
             .super__Head_base<0UL,_const_google::protobuf::Reflection_*,_false>._M_head_impl;
    (pTVar7->reflection)._M_t.
    super___uniq_ptr_impl<const_google::protobuf::Reflection,_std::default_delete<const_google::protobuf::Reflection>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_google::protobuf::Reflection_*,_std::default_delete<const_google::protobuf::Reflection>_>
    .super__Head_base<0UL,_const_google::protobuf::Reflection_*,_false>._M_head_impl = this_01;
    if (pRVar3 != (Reflection *)0x0) {
      operator_delete(pRVar3);
    }
    DynamicMessage::CrossLinkPrototypes(this_00);
  }
  else {
    this_00 = (*ppTVar6)->prototype;
  }
  return &this_00->super_Message;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    return MessageFactory::generated_factory()->GetPrototype(type);
  }

  const DynamicMessage::TypeInfo** target = &prototypes_->map_[type];
  if (*target != NULL) {
    // Already exists.
    return (*target)->prototype;
  }

  DynamicMessage::TypeInfo* type_info = new DynamicMessage::TypeInfo;
  *target = type_info;

  type_info->type = type;
  type_info->pool = (pool_ == NULL) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to Reflection's constructor.
  // This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.

  // Compute size and offsets.
  uint32* offsets = new uint32[type->field_count() + type->oneof_decl_count()];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  if (type->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    type_info->has_bits_offset = -1;
  } else {
    type_info->has_bits_offset = size;
    int has_bits_array_size =
        DivideRoundingUp(type->field_count(), bitsizeof(uint32));
    size += has_bits_array_size * sizeof(uint32);
    size = AlignOffset(size);

    uint32* has_bits_indices = new uint32[type->field_count()];
    for (int i = 0; i < type->field_count(); i++) {
      has_bits_indices[i] = i;
    }
    type_info->has_bits_indices.reset(has_bits_indices);
  }

  // The oneof_case, if any. It is an array of uint32s.
  if (type->oneof_decl_count() > 0) {
    type_info->oneof_case_offset = size;
    size += type->oneof_decl_count() * sizeof(uint32);
    size = AlignOffset(size);
  }

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  //
  // TODO(b/31226269):  Optimize the order of fields to minimize padding.
  int num_weak_fields = 0;
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    // Oneof fields do not use any space.
    if (!type->field(i)->containing_oneof()) {
      int field_size = FieldSpaceUsed(type->field(i));
      size = AlignTo(size, std::min(kSafeAlignment, field_size));
      offsets[i] = size;
      size += field_size;
    }
  }

  // The oneofs.
  for (int i = 0; i < type->oneof_decl_count(); i++) {
    size = AlignTo(size, kSafeAlignment);
    offsets[type->field_count() + i] = size;
    size += kMaxOneofUnionSize;
  }

  // Add the InternalMetadataWithArena to the end.
  size = AlignOffset(size);
  type_info->internal_metadata_offset = size;
  size += sizeof(InternalMetadataWithArena);

  type_info->weak_field_map_offset = -1;

  // Align the final size to make sure no clever allocators think that
  // alignment is not necessary.
  type_info->size = size;

  // Construct the reflection object.

  if (type->oneof_decl_count() > 0) {
    // Compute the size of default oneof instance and offsets of default
    // oneof fields.
    for (int i = 0; i < type->oneof_decl_count(); i++) {
      for (int j = 0; j < type->oneof_decl(i)->field_count(); j++) {
        const FieldDescriptor* field = type->oneof_decl(i)->field(j);
        int field_size = OneofFieldSpaceUsed(field);
        size = AlignTo(size, std::min(kSafeAlignment, field_size));
        offsets[field->index()] = size;
        size += field_size;
      }
    }
  }
  size = AlignOffset(size);
  // Allocate the prototype + oneof fields.
  void* base = operator new(size);
  memset(base, 0, size);

  // We have already locked the factory so we should not lock in the constructor
  // of dynamic message to avoid dead lock.
  DynamicMessage* prototype = new (base) DynamicMessage(type_info, false);

  if (type->oneof_decl_count() > 0 || num_weak_fields > 0) {
    // Construct default oneof instance.
    ConstructDefaultOneofInstance(type_info->type, type_info->offsets.get(),
                                  prototype);
  }

  internal::ReflectionSchema schema = {type_info->prototype,
                                       type_info->offsets.get(),
                                       type_info->has_bits_indices.get(),
                                       type_info->has_bits_offset,
                                       type_info->internal_metadata_offset,
                                       type_info->extensions_offset,
                                       type_info->oneof_case_offset,
                                       type_info->size,
                                       type_info->weak_field_map_offset};

  type_info->reflection.reset(
      new Reflection(type_info->type, schema, type_info->pool, this));

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}